

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplers.cpp
# Opt level: O2

vector<pbrt::SamplerHandle,_std::allocator<pbrt::SamplerHandle>_> * __thiscall
pbrt::SobolSampler::Clone
          (vector<pbrt::SamplerHandle,_std::allocator<pbrt::SamplerHandle>_> *__return_storage_ptr__
          ,SobolSampler *this,int n,Allocator alloc)

{
  int *piVar1;
  pointer pSVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  int64_t iVar5;
  SobolSampler *pSVar6;
  long lVar7;
  SobolSampler *pSVar8;
  ulong uVar9;
  allocator_type local_31;
  polymorphic_allocator<std::byte> local_30;
  
  local_30.memoryResource = alloc.memoryResource;
  std::vector<pbrt::SamplerHandle,_std::allocator<pbrt::SamplerHandle>_>::vector
            (__return_storage_ptr__,(long)n,&local_31);
  pSVar6 = pstd::pmr::polymorphic_allocator<std::byte>::allocate_object<pbrt::SobolSampler>
                     (&local_30,(long)n);
  pSVar2 = (__return_storage_ptr__->
           super__Vector_base<pbrt::SamplerHandle,_std::allocator<pbrt::SamplerHandle>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pSVar8 = pSVar6;
  for (lVar7 = 0; (ulong)(uint)(~(n >> 0x1f) & n) << 3 != lVar7; lVar7 = lVar7 + 8) {
    uVar3 = *(undefined8 *)&this->randomizeStrategy;
    uVar4 = *(undefined8 *)&(this->pixel).super_Tuple2<pbrt::Point2,_int>.y;
    iVar5 = this->sobolIndex;
    uVar9 = (ulong)pSVar8 | 0x5000000000000;
    pSVar8 = pSVar8 + 1;
    piVar1 = &pSVar6->samplesPerPixel + lVar7;
    *(undefined8 *)piVar1 = *(undefined8 *)this;
    *(undefined8 *)(piVar1 + 2) = uVar3;
    *(undefined8 *)(piVar1 + 4) = uVar4;
    *(int64_t *)(piVar1 + 6) = iVar5;
    *(ulong *)((long)&(pSVar2->
                      super_TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
                      ).bits + lVar7) = uVar9;
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<SamplerHandle> SobolSampler::Clone(int n, Allocator alloc) {
    std::vector<SamplerHandle> samplers(n);
    SobolSampler *samplerMem = (SobolSampler *)alloc.allocate_object<SobolSampler>(n);
    for (int i = 0; i < n; ++i) {
        alloc.construct(&samplerMem[i], *this);
        samplers[i] = &samplerMem[i];
    }
    return samplers;
}